

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O3

adios2_error adios2_variable_shapeid(adios2_shapeid *shapeid,adios2_variable *variable)

{
  int iVar1;
  invalid_argument *this;
  long *plVar2;
  long *plVar3;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"for const adios2_variable, in call to adios2_variable_shapeid","")
  ;
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  iVar1 = *(int *)(variable + 0x40);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"in call to adios2_variable_shapeid","");
  if ((uint)(iVar1 + adios2_shapeid_unknown) < 5) {
    *shapeid = iVar1 + adios2_shapeid_unknown;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return adios2_error_none;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"ERROR: invalid adios2_shapeid, ",&local_88);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_a8 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_a8 == plVar3) {
    local_98 = *plVar3;
    lStack_90 = plVar2[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar3;
  }
  local_a0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::invalid_argument::invalid_argument(this,(string *)&local_a8);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

adios2_error adios2_variable_shapeid(adios2_shapeid *shapeid, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_shapeid");
        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        *shapeid = adios2_ToShapeID(variableBase->m_ShapeID, "in call to adios2_variable_shapeid");
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_variable_shapeid"));
    }
}